

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol_tests.cpp
# Opt level: O2

void __thiscall torcontrol_tests::util_SplitTorReplyLine::test_method(util_SplitTorReplyLine *this)

{
  long in_FS_OFFSET;
  allocator<char> local_3d3;
  allocator<char> local_3d2;
  allocator<char> local_3d1;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"PROTOCOLINFO PIVERSION",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"PROTOCOLINFO",&local_3d2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"PIVERSION",&local_3d3);
  CheckSplitTorReplyLine(&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "AUTH METHODS=COOKIE,SAFECOOKIE COOKIEFILE=\"/home/x/.tor/control_auth_cookie\"",
             &local_3d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"AUTH",&local_3d2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "METHODS=COOKIE,SAFECOOKIE COOKIEFILE=\"/home/x/.tor/control_auth_cookie\"",&local_3d3)
  ;
  CheckSplitTorReplyLine(&local_90,&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"AUTH METHODS=NULL",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"AUTH",&local_3d2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"METHODS=NULL",&local_3d3)
  ;
  CheckSplitTorReplyLine(&local_f0,&local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"AUTH METHODS=HASHEDPASSWORD",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"AUTH",&local_3d2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"METHODS=HASHEDPASSWORD",&local_3d3);
  CheckSplitTorReplyLine(&local_150,&local_170,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"VERSION Tor=\"0.2.9.8 (git-a0df013ea241b026)\"",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"VERSION",&local_3d2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Tor=\"0.2.9.8 (git-a0df013ea241b026)\"",&local_3d3);
  CheckSplitTorReplyLine(&local_1b0,&local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"AUTHCHALLENGE SERVERHASH=aaaa SERVERNONCE=bbbb",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"AUTHCHALLENGE",&local_3d2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"SERVERHASH=aaaa SERVERNONCE=bbbb",&local_3d3);
  CheckSplitTorReplyLine(&local_210,&local_230,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"COMMAND",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"COMMAND",&local_3d2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"",&local_3d3);
  CheckSplitTorReplyLine(&local_270,&local_290,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"COMMAND SOME  ARGS",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"COMMAND",&local_3d2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"SOME  ARGS",&local_3d3);
  CheckSplitTorReplyLine(&local_2d0,&local_2f0,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"COMMAND  ARGS",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"COMMAND",&local_3d2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370," ARGS",&local_3d3);
  CheckSplitTorReplyLine(&local_330,&local_350,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"COMMAND   EVEN+more  ARGS",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"COMMAND",&local_3d2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"  EVEN+more  ARGS",&local_3d3);
  CheckSplitTorReplyLine(&local_390,&local_3b0,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_SplitTorReplyLine)
{
    // Data we should receive during normal usage
    CheckSplitTorReplyLine(
        "PROTOCOLINFO PIVERSION",
        "PROTOCOLINFO", "PIVERSION");
    CheckSplitTorReplyLine(
        "AUTH METHODS=COOKIE,SAFECOOKIE COOKIEFILE=\"/home/x/.tor/control_auth_cookie\"",
        "AUTH", "METHODS=COOKIE,SAFECOOKIE COOKIEFILE=\"/home/x/.tor/control_auth_cookie\"");
    CheckSplitTorReplyLine(
        "AUTH METHODS=NULL",
        "AUTH", "METHODS=NULL");
    CheckSplitTorReplyLine(
        "AUTH METHODS=HASHEDPASSWORD",
        "AUTH", "METHODS=HASHEDPASSWORD");
    CheckSplitTorReplyLine(
        "VERSION Tor=\"0.2.9.8 (git-a0df013ea241b026)\"",
        "VERSION", "Tor=\"0.2.9.8 (git-a0df013ea241b026)\"");
    CheckSplitTorReplyLine(
        "AUTHCHALLENGE SERVERHASH=aaaa SERVERNONCE=bbbb",
        "AUTHCHALLENGE", "SERVERHASH=aaaa SERVERNONCE=bbbb");

    // Other valid inputs
    CheckSplitTorReplyLine("COMMAND", "COMMAND", "");
    CheckSplitTorReplyLine("COMMAND SOME  ARGS", "COMMAND", "SOME  ARGS");

    // These inputs are valid because PROTOCOLINFO accepts an OtherLine that is
    // just an OptArguments, which enables multiple spaces to be present
    // between the command and arguments.
    CheckSplitTorReplyLine("COMMAND  ARGS", "COMMAND", " ARGS");
    CheckSplitTorReplyLine("COMMAND   EVEN+more  ARGS", "COMMAND", "  EVEN+more  ARGS");
}